

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O1

int Lodtalk::Object::stSize(InterpreterProxy *interpreter)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar2;
  }
  uVar3 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  if ((uVar3 & 7) != 0) {
LAB_0013f7ef:
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar2;
  }
  uVar1 = *(ulong *)CONCAT44(extraout_var_00,uVar3);
  uVar4 = (uint)(uVar1 >> 0x23);
  uVar5 = uVar4 & 0x1f;
  if (0x16 < uVar5 - 9) {
    if (5 < uVar5) goto LAB_0013f878;
    if ((0x1cU >> uVar5 & 1) == 0) goto LAB_0013f7ef;
  }
  uVar6 = uVar1 & 0xff;
  if (uVar6 == 0xff) {
    uVar6 = ((ulong *)CONCAT44(extraout_var_00,uVar3))[-1];
  }
  if (uVar5 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = uVar6;
    if (8 < uVar5) {
      if (uVar5 < 0x10) {
        stSize();
LAB_0013f878:
        abort();
      }
      uVar7 = ((ulong)(uVar4 & 7) - 8) + uVar6 * 8;
      if ((uVar1 >> 0x23 & 7) == 0) {
        uVar7 = uVar6 * 8;
      }
    }
  }
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x15])(interpreter,uVar7);
  return iVar2;
}

Assistant:

int Object::stSize(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    auto self = interpreter->getReceiver();
	if(!self.isPointer())
        return interpreter->primitiveFailed();

	if(!self.isIndexable())
		return interpreter->primitiveFailed();

	return interpreter->returnSmallInteger(self.getNumberOfElements());
}